

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,3>,tcu::Vector<float,3>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  ostringstream *poVar1;
  _Rb_tree_node_base *p_Var2;
  pointer pVVar3;
  pointer pVVar4;
  Variable<tcu::Vector<float,_3>_> *pVVar5;
  pointer pcVar6;
  double dVar7;
  FloatFormat *fmt;
  undefined8 uVar8;
  bool bVar9;
  bool bVar10;
  ContextType type;
  int iVar11;
  _Rb_tree_node_base *p_Var12;
  char *pcVar13;
  size_t sVar14;
  long *plVar15;
  ShaderExecutor *pSVar16;
  long lVar17;
  IVal *pIVar18;
  TestError *this_00;
  uint uVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  Vector<float,_3> *pVVar21;
  ulong uVar22;
  float *value;
  MessageBuilder *pMVar23;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>_>_>
  *pVVar24;
  byte bVar25;
  IVal in2;
  IVal reference1;
  IVal in3;
  ostringstream os;
  FuncSet funcs;
  FloatFormat highpFmt;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>_>_>
  outputs;
  ShaderSpec spec;
  ostringstream oss;
  pointer local_558;
  undefined1 local_550 [12];
  undefined4 uStack_544;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_540;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>_>_>
  *local_530;
  undefined1 local_528 [16];
  IVal local_518;
  size_t local_4d0;
  Statement *local_4c8;
  ulong local_4c0;
  string local_4b8;
  ResultCollector *local_498;
  ulong local_490;
  undefined1 local_488 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  double local_468;
  Data local_460;
  undefined4 local_450;
  ios_base local_418 [8];
  ios_base local_410 [256];
  undefined1 auStack_310 [8];
  undefined8 uStack_308;
  undefined1 local_300 [16];
  _Base_ptr local_2f0;
  _Rb_tree_node_base *local_2e8;
  _Rb_tree_node_base *local_2e0;
  double local_2d8;
  FloatFormat local_2b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_290;
  ulong local_260;
  FloatFormat *local_258;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>_>_>
  local_250;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  bVar25 = 0;
  pVVar3 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar4 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_4d0 = ((long)pVVar4 - (long)pVVar3 >> 2) * -0x5555555555555555;
  local_530 = variables;
  local_518.m_data[2].m_hi = (double)inputs;
  local_4c8 = stmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>_>_>
  ::Outputs(&local_250,local_4d0);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_2b8.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_2b8.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_2b8.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_2b8.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_2b8.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_2b8.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_2b8.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_2b8.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_2b8._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_290._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_290._M_impl.super__Rb_tree_header._M_header;
  local_290._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_290._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_290._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_488._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_488 + 8);
  local_290._M_impl.super__Rb_tree_header._M_header._M_right =
       local_290._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Statement: ",0xb);
  (*local_4c8->_vptr_Statement[2])(local_4c8,poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_410);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var2 = (_Rb_tree_node_base *)(local_300 + 8);
  local_300._8_4_ = _S_red;
  local_2f0 = (_Base_ptr)0x0;
  local_2d8 = 0.0;
  local_558 = pVVar3;
  local_2e8 = p_Var2;
  local_2e0 = p_Var2;
  (*local_4c8->_vptr_Statement[4])(local_4c8,local_300);
  if (local_2e8 != p_Var2) {
    p_Var12 = local_2e8;
    do {
      (**(code **)(**(long **)(p_Var12 + 1) + 0x30))(*(long **)(p_Var12 + 1),local_1a8);
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
    } while (p_Var12 != p_Var2);
  }
  if (local_2d8 != 0.0) {
    local_488._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_488 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(char *)local_528._0_8_,local_528._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_528._0_8_ != (IVal *)(local_528 + 0x10)) {
      operator_delete((void *)local_528._0_8_,local_518.m_data[0]._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_410);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_300);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"precision ",10);
  pcVar13 = glu::getPrecisionName((this->m_ctx).precision);
  if (pcVar13 == (char *)0x0) {
    std::ios::clear((int)((long)&local_558 + *(long *)(local_488._0_8_ + -0x18)) + 0xd0);
  }
  else {
    sVar14 = strlen(pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,pcVar13,sVar14);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar6 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar6) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
  std::ios_base::~ios_base(local_418);
  type.super_ApiType.m_bits = (ApiType)(*((this->m_ctx).renderContext)->_vptr_RenderContext[2])();
  pVVar24 = local_530;
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((this->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&this->m_extension);
    plVar15 = (long *)std::__cxx11::string::append(local_1a8);
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar15 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar15 == paVar20) {
      local_478._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_478._8_8_ = plVar15[3];
      local_488._0_8_ = &local_478;
    }
    else {
      local_478._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_488._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar15;
    }
    local_488._8_8_ = plVar15[1];
    *plVar15 = (long)paVar20;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_488);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._0_8_ != &local_478) {
      operator_delete((void *)local_488._0_8_,local_478._M_allocated_capacity + 1);
    }
    pVVar24 = local_530;
    if ((pointer)local_1a8._0_8_ != pcVar6) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),2);
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_488,this,
             (pVVar24->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar8 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)(local_220._8_8_ + 0x38),(string *)local_488);
  glu::VarType::operator=(&((pointer)(uVar8 + 0x38))->varType,(VarType *)&local_468);
  glu::VarType::~VarType((VarType *)&local_468);
  pVVar24 = local_530;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._0_8_ != &local_478) {
    operator_delete((void *)local_488._0_8_,local_478._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_488,this,
             (pVVar24->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar8 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_488);
  glu::VarType::operator=((VarType *)(uVar8 + 0x20),(VarType *)&local_468);
  glu::VarType::~VarType((VarType *)&local_468);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._0_8_ != &local_478) {
    operator_delete((void *)local_488._0_8_,local_478._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),2);
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_488,this,
             (local_530->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar8 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)(local_220._32_8_ + 0x38),(string *)local_488);
  glu::VarType::operator=(&((pointer)(uVar8 + 0x38))->varType,(VarType *)&local_468);
  glu::VarType::~VarType((VarType *)&local_468);
  pVVar24 = local_530;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._0_8_ != &local_478) {
    operator_delete((void *)local_488._0_8_,local_478._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_488,this,
             (pVVar24->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar8 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_488);
  glu::VarType::operator=((VarType *)(uVar8 + 0x20),(VarType *)&local_468);
  glu::VarType::~VarType((VarType *)&local_468);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._0_8_ != &local_478) {
    operator_delete((void *)local_488._0_8_,local_478._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
  (*local_4c8->_vptr_Statement[2])(local_4c8,local_488);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
  std::ios_base::~ios_base(local_418);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar6) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pSVar16 = ShaderExecUtil::createExecutor
                      ((this->m_ctx).renderContext,(this->m_ctx).shaderType,(ShaderSpec *)local_220)
  ;
  local_488._0_8_ =
       (((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
        local_518.m_data[2].m_hi)->
       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_488._8_8_ =
       (((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
        ((long)local_518.m_data[2].m_hi + 0x18))->
       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_478._M_allocated_capacity =
       (size_type)
       (((vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
          *)((long)local_518.m_data[2].m_hi + 0x30))->
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_478._8_8_ =
       (((vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
          *)((long)local_518.m_data[2].m_hi + 0x48))->
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_250.out0.
       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_250.out1.
       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (*pSVar16->_vptr_ShaderExecutor[3])
            (pSVar16,((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar11 = (*pSVar16->_vptr_ShaderExecutor[2])(pSVar16);
  if ((char)iVar11 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar16->_vptr_ShaderExecutor[5])(pSVar16);
  (*pSVar16->_vptr_ShaderExecutor[6])(pSVar16,local_4d0,local_488);
  local_518.m_data[2].m_lo = (double)this;
  (*pSVar16->_vptr_ShaderExecutor[1])(pSVar16);
  pVVar24 = local_530;
  lVar17 = 0x10;
  do {
    *(undefined1 *)((long)&local_498 + lVar17) = 0;
    *(undefined8 *)((long)&local_490 + lVar17) = 0x7ff0000000000000;
    *(undefined8 *)(local_488 + lVar17) = 0xfff0000000000000;
    lVar17 = lVar17 + 0x18;
  } while (lVar17 != 0x58);
  lVar17 = 0x10;
  do {
    *(undefined1 *)((long)&local_498 + lVar17) = 0;
    *(undefined8 *)((long)&local_490 + lVar17) = 0x7ff0000000000000;
    *(undefined8 *)(local_488 + lVar17) = 0xfff0000000000000;
    lVar17 = lVar17 + 0x18;
  } while (lVar17 != 0x58);
  lVar17 = 0x10;
  do {
    local_1b8._M_local_buf[lVar17] = '\0';
    *(undefined8 *)(local_1a8 + lVar17 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar17) = 0xfff0000000000000;
    lVar17 = lVar17 + 0x18;
  } while (lVar17 != 0x58);
  lVar17 = 0x10;
  do {
    local_1b8._M_local_buf[lVar17] = '\0';
    *(undefined8 *)(local_1a8 + lVar17 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar17) = 0xfff0000000000000;
    lVar17 = lVar17 + 0x18;
  } while (lVar17 != 0x58);
  lVar17 = 0x10;
  do {
    auStack_310[lVar17] = 0;
    *(undefined8 *)((long)&uStack_308 + lVar17) = 0x7ff0000000000000;
    *(undefined8 *)(local_300 + lVar17) = 0xfff0000000000000;
    lVar17 = lVar17 + 0x18;
  } while (lVar17 != 0x58);
  lVar17 = 0x10;
  do {
    auStack_310[lVar17] = 0;
    *(undefined8 *)((long)&uStack_308 + lVar17) = 0x7ff0000000000000;
    *(undefined8 *)(local_300 + lVar17) = 0xfff0000000000000;
    lVar17 = lVar17 + 0x18;
  } while (lVar17 != 0x58);
  lVar17 = 0x10;
  do {
    local_540._M_local_buf[lVar17 + 8] = '\0';
    *(undefined8 *)((long)&local_530 + lVar17) = 0x7ff0000000000000;
    *(undefined8 *)(local_528 + lVar17) = 0xfff0000000000000;
    lVar17 = lVar17 + 0x18;
  } while (lVar17 != 0x58);
  lVar17 = 0x10;
  do {
    local_540._M_local_buf[lVar17 + 8] = '\0';
    *(undefined8 *)((long)&local_530 + lVar17) = 0x7ff0000000000000;
    *(undefined8 *)(local_528 + lVar17) = 0xfff0000000000000;
    lVar17 = lVar17 + 0x18;
  } while (lVar17 != 0x58);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_290,
             (local_530->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr,(IVal *)local_488);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_290,
             (pVVar24->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_290,
             (pVVar24->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_550);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_290,
             (pVVar24->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_4b8);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_290,
             (pVVar24->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr,(IVal *)local_300);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_290,
             (pVVar24->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr,(IVal *)local_528);
  if (pVVar4 == local_558) {
    local_4c0 = 0;
  }
  else {
    local_498 = (ResultCollector *)((long)local_518.m_data[2].m_lo + 0x100);
    local_260 = local_4d0 + (local_4d0 == 0);
    uVar22 = 0;
    local_4c0 = 0;
    local_258 = &(this->m_ctx).floatFormat;
    do {
      lVar17 = 0x10;
      do {
        local_1b8._M_local_buf[lVar17] = '\0';
        *(undefined8 *)(local_1a8 + lVar17 + -8) = 0x7ff0000000000000;
        *(undefined8 *)(local_1a8 + lVar17) = 0xfff0000000000000;
        lVar17 = lVar17 + 0x18;
      } while (lVar17 != 0x58);
      lVar17 = 0x10;
      do {
        local_1b8._M_local_buf[lVar17] = '\0';
        *(undefined8 *)(local_1a8 + lVar17 + -8) = 0x7ff0000000000000;
        *(undefined8 *)(local_1a8 + lVar17) = 0xfff0000000000000;
        lVar17 = lVar17 + 0x18;
      } while (lVar17 != 0x58);
      lVar17 = 0x10;
      do {
        auStack_310[lVar17] = 0;
        *(undefined8 *)((long)&uStack_308 + lVar17) = 0x7ff0000000000000;
        *(undefined8 *)(local_300 + lVar17) = 0xfff0000000000000;
        lVar17 = lVar17 + 0x18;
      } while (lVar17 != 0x58);
      lVar17 = 0x10;
      do {
        auStack_310[lVar17] = 0;
        *(undefined8 *)((long)&uStack_308 + lVar17) = 0x7ff0000000000000;
        *(undefined8 *)(local_300 + lVar17) = 0xfff0000000000000;
        lVar17 = lVar17 + 0x18;
      } while (lVar17 != 0x58);
      local_490 = uVar22;
      if ((uVar22 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog
                  ((((TestCase *)local_518.m_data[2].m_lo)->super_TestNode).m_testCtx);
      }
      fmt = local_258;
      pVVar3 = (((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                local_518.m_data[2].m_hi)->
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      local_558 = (pointer)(local_490 * 3);
      local_550._8_4_ = pVVar3[local_490].m_data[2];
      local_550._0_8_ = *(undefined8 *)pVVar3[local_490].m_data;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                ((IVal *)local_528,local_258,(Vector<float,_3> *)local_550);
      pVVar24 = local_530;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_488,fmt,(IVal *)local_528);
      pIVar18 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_290,
                           (pVVar24->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      pMVar23 = (MessageBuilder *)local_488;
      for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
        *(TestLog **)pIVar18->m_data = pMVar23->m_log;
        pMVar23 = (MessageBuilder *)((long)pMVar23 + (ulong)bVar25 * -0x10 + 8);
        pIVar18 = (IVal *)((long)pIVar18 + ((ulong)bVar25 * -2 + 1) * 8);
      }
      pVVar3 = (((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                ((long)local_518.m_data[2].m_hi + 0x18))->
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      local_550._8_4_ = pVVar3->m_data[(long)((long)local_558->m_data + 2)];
      local_550._0_8_ = *(undefined8 *)(pVVar3->m_data + (long)local_558);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                ((IVal *)local_528,fmt,(Vector<float,_3> *)local_550);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_488,fmt,(IVal *)local_528);
      pIVar18 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_290,
                           (pVVar24->in1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      pMVar23 = (MessageBuilder *)local_488;
      for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
        *(TestLog **)pIVar18->m_data = pMVar23->m_log;
        pMVar23 = (MessageBuilder *)((long)pMVar23 + (ulong)bVar25 * -0x10 + 8);
        pIVar18 = (IVal *)((long)pIVar18 + ((ulong)bVar25 * -2 + 1) * 8);
      }
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_290,
                 (pVVar24->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_290,
                 (pVVar24->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_460.basic.type = ((Context *)((long)local_518.m_data[2].m_lo + 0x70))->precision;
      local_468 = fmt->m_maxValue;
      local_488._0_8_ = *(undefined8 *)fmt;
      local_488._8_8_ = *(undefined8 *)&fmt->m_fractionBits;
      local_478._M_allocated_capacity = *(undefined8 *)&fmt->m_hasInf;
      local_478._8_8_ = *(undefined8 *)&fmt->m_exactPrecision;
      local_450 = 0;
      local_460._8_8_ = &local_290;
      (*local_4c8->_vptr_Statement[3])(local_4c8,(MessageBuilder *)local_488);
      pIVar18 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_290,
                           (pVVar24->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_488,&local_2b8,pIVar18);
      pMVar23 = (MessageBuilder *)local_488;
      pIVar18 = (IVal *)local_300;
      for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
        *(TestLog **)pIVar18->m_data = pMVar23->m_log;
        pMVar23 = (MessageBuilder *)((long)pMVar23 + (ulong)bVar25 * -0x10 + 8);
        pIVar18 = (IVal *)((long)pIVar18 + ((ulong)bVar25 * -2 + 1) * 8);
      }
      value = (local_250.out1.
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->m_data + (long)local_558;
      local_558 = (pointer)((long)local_558 * 4);
      bVar9 = ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doContains
                        ((IVal *)local_300,(Vector<float,_3> *)value);
      local_488._0_8_ = &local_478;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_488,"Shader output 1 is outside acceptable range","");
      bVar9 = tcu::ResultCollector::check(local_498,bVar9,(string *)local_488);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._0_8_ != &local_478) {
        operator_delete((void *)local_488._0_8_,(ulong)(local_478._M_allocated_capacity + 1));
      }
      pIVar18 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_290,
                           (local_530->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_488,&local_2b8,pIVar18);
      pMVar23 = (MessageBuilder *)local_488;
      pIVar18 = (IVal *)local_1a8;
      for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
        *(TestLog **)pIVar18->m_data = pMVar23->m_log;
        pMVar23 = (MessageBuilder *)((long)pMVar23 + (ulong)bVar25 * -0x10 + 8);
        pIVar18 = (IVal *)((long)pIVar18 + ((ulong)bVar25 * -2 + 1) * 8);
      }
      bVar10 = ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doContains
                         ((IVal *)local_1a8,
                          (Vector<float,_3> *)
                          ((long)(local_250.out0.
                                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data +
                          (long)local_558));
      local_488._0_8_ = &local_478;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_488,"Shader output 0 is outside acceptable range","");
      bVar10 = tcu::ResultCollector::check(local_498,bVar10,(string *)local_488);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._0_8_ != &local_478) {
        operator_delete((void *)local_488._0_8_,(ulong)(local_478._M_allocated_capacity + 1));
      }
      uVar19 = (int)local_4c0 + ((byte)~(bVar9 && bVar10) & 1);
      local_4c0 = (ulong)uVar19;
      poVar1 = (ostringstream *)(local_488 + 8);
      if ((int)uVar19 < 0x65 && (!bVar9 || !bVar10)) {
        local_488._0_8_ =
             ((((TestCase *)local_518.m_data[2].m_lo)->super_TestNode).m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        pcVar13 = "Failed";
        if (bVar9 && bVar10) {
          pcVar13 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar13,6);
        pVVar24 = local_530;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
        pVVar5 = (pVVar24->in0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                 .m_ptr;
        pVVar21 = (Vector<float,_3> *)(local_528 + 0x10);
        pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
        local_528._0_8_ = pVVar21;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_528,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)local_528._0_8_,local_528._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = ",3);
        valueToString<tcu::Vector<float,3>>
                  ((string *)local_550,(BuiltinPrecisionTests *)&local_2b8,
                   (FloatFormat *)
                   ((long)local_558->m_data +
                   (long)(((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *
                           )local_518.m_data[2].m_hi)->
                         super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                         )._M_impl.super__Vector_impl_data._M_start),pVVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)local_550._0_8_,CONCAT44(uStack_544,local_550._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._0_8_ != &local_540) {
          operator_delete((void *)local_550._0_8_,local_540._M_allocated_capacity + 1);
        }
        if ((Vector<float,_3> *)local_528._0_8_ != (Vector<float,_3> *)(local_528 + 0x10)) {
          operator_delete((void *)local_528._0_8_,local_518.m_data[0]._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
        pVVar5 = (pVVar24->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                 .m_ptr;
        pVVar21 = (Vector<float,_3> *)(local_528 + 0x10);
        pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
        local_528._0_8_ = pVVar21;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_528,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)local_528._0_8_,local_528._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = ",3);
        valueToString<tcu::Vector<float,3>>
                  ((string *)local_550,(BuiltinPrecisionTests *)&local_2b8,
                   (FloatFormat *)
                   ((long)local_558->m_data +
                   (long)(((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *
                           )((long)local_518.m_data[2].m_hi + 0x18))->
                         super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                         )._M_impl.super__Vector_impl_data._M_start),pVVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)local_550._0_8_,CONCAT44(uStack_544,local_550._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._0_8_ != &local_540) {
          operator_delete((void *)local_550._0_8_,local_540._M_allocated_capacity + 1);
        }
        if ((Vector<float,_3> *)local_528._0_8_ != (Vector<float,_3> *)(local_528 + 0x10)) {
          operator_delete((void *)local_528._0_8_,local_518.m_data[0]._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
        pVVar5 = (pVVar24->out0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                 .m_ptr;
        pIVar18 = (IVal *)(local_528 + 0x10);
        pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
        local_528._0_8_ = pIVar18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_528,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)local_528._0_8_,local_528._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = ",3);
        valueToString<tcu::Vector<float,3>>
                  ((string *)local_550,(BuiltinPrecisionTests *)&local_2b8,
                   (FloatFormat *)
                   ((long)(local_250.out0.
                           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + (long)local_558),
                   (Vector<float,_3> *)pIVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)local_550._0_8_,CONCAT44(uStack_544,local_550._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,3>>
                  (&local_4b8,(BuiltinPrecisionTests *)&local_2b8,(FloatFormat *)local_1a8,pIVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
          operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._0_8_ != &local_540) {
          operator_delete((void *)local_550._0_8_,local_540._M_allocated_capacity + 1);
        }
        if ((IVal *)local_528._0_8_ != (IVal *)(local_528 + 0x10)) {
          operator_delete((void *)local_528._0_8_,local_518.m_data[0]._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
        pVVar5 = (pVVar24->out1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                 .m_ptr;
        pIVar18 = (IVal *)(local_528 + 0x10);
        pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
        local_528._0_8_ = pIVar18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_528,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)local_528._0_8_,local_528._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = ",3);
        valueToString<tcu::Vector<float,3>>
                  ((string *)local_550,(BuiltinPrecisionTests *)&local_2b8,
                   (FloatFormat *)
                   ((long)local_558->m_data +
                   (long)local_250.out1.
                         super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                         ._M_impl.super__Vector_impl_data._M_start),(Vector<float,_3> *)pIVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)local_550._0_8_,CONCAT44(uStack_544,local_550._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,3>>
                  (&local_4b8,(BuiltinPrecisionTests *)&local_2b8,(FloatFormat *)local_300,pIVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,local_4b8._M_dataplus._M_p,local_4b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
          operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._0_8_ != &local_540) {
          operator_delete((void *)local_550._0_8_,local_540._M_allocated_capacity + 1);
        }
        if ((IVal *)local_528._0_8_ != (IVal *)(local_528 + 0x10)) {
          operator_delete((void *)local_528._0_8_,local_518.m_data[0]._0_8_ + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_410);
      }
      uVar22 = local_490 + 1;
    } while (uVar22 != local_260);
  }
  dVar7 = local_518.m_data[2].m_lo;
  iVar11 = (int)local_4c0;
  if (100 < iVar11) {
    local_488._0_8_ = ((((TestCase *)local_518.m_data[2].m_lo)->super_TestNode).m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_488 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"(Skipped ",9);
    std::ostream::operator<<(poVar1,iVar11 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_410);
  }
  if (iVar11 == 0) {
    local_488._0_8_ = ((((TestCase *)dVar7)->super_TestNode).m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_488 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_488._0_8_ = ((((TestCase *)dVar7)->super_TestNode).m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_488 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::ostream::operator<<(poVar1,iVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_488 + 8));
  std::ios_base::~ios_base(local_410);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if (local_250.out1.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.out1.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.out1.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.out1.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_250.out0.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.out0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.out0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.out0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}